

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void lr_sync_write(void *lr_sync,int r,int c,int sb_cols,int plane)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (c < sb_cols + -1) {
    if (c % *(int *)((long)lr_sync + 0x48) != 0) {
      return;
    }
  }
  else {
    c = *(int *)((long)lr_sync + 0x48) + sb_cols;
  }
  lVar4 = (long)plane;
  lVar3 = (long)r;
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)lr_sync + lVar4 * 8) + lVar3 * 0x28));
  lVar2 = *(long *)((long)lr_sync + lVar4 * 8 + 0x30);
  iVar1 = *(int *)(lVar2 + lVar3 * 4);
  if (c < iVar1) {
    c = iVar1;
  }
  *(int *)(lVar2 + lVar3 * 4) = c;
  pthread_cond_broadcast
            ((pthread_cond_t *)(lVar3 * 0x30 + *(long *)((long)lr_sync + lVar4 * 8 + 0x18)));
  pthread_mutex_unlock((pthread_mutex_t *)(lVar3 * 0x28 + *(long *)((long)lr_sync + lVar4 * 8)));
  return;
}

Assistant:

static inline void lr_sync_write(void *const lr_sync, int r, int c,
                                 const int sb_cols, int plane) {
#if CONFIG_MULTITHREAD
  AV1LrSync *const loop_res_sync = (AV1LrSync *)lr_sync;
  const int nsync = loop_res_sync->sync_range;
  int cur;
  // Only signal when there are enough filtered SB for next row to run.
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync;
  }

  if (sig) {
    pthread_mutex_lock(&loop_res_sync->mutex_[plane][r]);

    // When a thread encounters an error, cur_sb_col[plane][r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // cur_sb_col[plane][r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    loop_res_sync->cur_sb_col[plane][r] =
        AOMMAX(loop_res_sync->cur_sb_col[plane][r], cur);

    pthread_cond_broadcast(&loop_res_sync->cond_[plane][r]);
    pthread_mutex_unlock(&loop_res_sync->mutex_[plane][r]);
  }
#else
  (void)lr_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}